

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O2

string * fs_trim_abi_cxx11_(string_view s)

{
  long lVar1;
  string *in_RDI;
  allocator<char> local_21;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)in_RDI,&local_20,&local_21);
  lVar1 = std::__cxx11::string::find((char)in_RDI,0);
  if (lVar1 != -1) {
    std::__cxx11::string::resize((ulong)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string
fs_trim(std::string_view s)
{
  // trim trailing nulls
  std::string r(s);
  if(auto i = r.find('\0'); i != std::string::npos)
    r.resize(i);

  return r;
}